

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  pointer ppSVar1;
  StackInst *pSVar2;
  uint uVar3;
  uint i;
  bool bVar4;
  
  i = 0;
  bVar4 = false;
  while( true ) {
    ppSVar1 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= (ulong)i)
    break;
    pSVar2 = ppSVar1[i];
    if (pSVar2 != (StackInst *)0x0) {
      if (bVar4) {
        uVar3 = pSVar2->op - BlockEnd;
        if ((uVar3 < 0xb) && ((0x7adU >> (uVar3 & 0x1f) & 1) != 0)) {
          bVar4 = false;
        }
        else {
          removeAt(this,i);
          bVar4 = true;
        }
      }
      else {
        bVar4 = (pSVar2->type).id == 1;
      }
    }
    i = i + 1;
  }
  return;
}

Assistant:

void dce() {
    bool inUnreachableCode = false;
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      if (inUnreachableCode) {
        // Does the unreachable code end here?
        if (isControlFlowBarrier(inst)) {
          inUnreachableCode = false;
        } else {
          // We can remove this.
          removeAt(i);
        }
      } else if (inst->type == Type::unreachable) {
        inUnreachableCode = true;
      }
    }
  }